

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O2

void cvprod(float *a,float *b,float *out,long N)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  ulong uVar10;
  long lVar11;
  long unaff_RBX;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar8 = _DAT_001053c0;
  if (3 < N) {
    uVar10 = (ulong)N >> 2;
    out = out + 8;
    auVar12 = vgatherdps_avx512vl(*(undefined4 *)((long)a + N));
    auVar13 = vgatherdps_avx512vl(*(undefined4 *)((long)a + unaff_RBX));
    auVar2 = *(undefined1 (*) [32])b;
    b = b + 8;
    auVar4 = vpermps_avx2(_DAT_001053c0,ZEXT1632(auVar13));
    auVar5 = vpermps_avx2(_DAT_001053c0,ZEXT1632(auVar12));
    auVar3 = vshufps_avx(auVar2,auVar2,0xb1);
    auVar6._4_4_ = auVar4._4_4_ * auVar3._4_4_;
    auVar6._0_4_ = auVar4._0_4_ * auVar3._0_4_;
    auVar6._8_4_ = auVar4._8_4_ * auVar3._8_4_;
    auVar6._12_4_ = auVar4._12_4_ * auVar3._12_4_;
    auVar6._16_4_ = auVar4._16_4_ * auVar3._16_4_;
    auVar6._20_4_ = auVar4._20_4_ * auVar3._20_4_;
    auVar6._24_4_ = auVar4._24_4_ * auVar3._24_4_;
    auVar6._28_4_ = auVar4._28_4_;
    auVar12 = vfmaddsub231ps_fma(auVar6,auVar2,auVar5);
    while (1 < (long)uVar10) {
      auVar2 = *(undefined1 (*) [32])b;
      uVar10 = uVar10 - 1;
      b = (float *)((long)b + 0x20);
      auVar13 = vgatherdps_avx512vl(*(undefined4 *)((long)a + uVar10));
      auVar14 = vgatherdps_avx512vl(*(undefined4 *)((long)a + unaff_RBX));
      *(undefined1 (*) [32])(out + -8) = ZEXT1632(auVar12);
      a = a + 8;
      out = out + 8;
      auVar4 = vpermps_avx2(auVar8,ZEXT1632(auVar13));
      auVar5 = vpermps_avx2(auVar8,ZEXT1632(auVar14));
      auVar3 = vshufps_avx(auVar2,auVar2,0xb1);
      auVar7._4_4_ = auVar5._4_4_ * auVar3._4_4_;
      auVar7._0_4_ = auVar5._0_4_ * auVar3._0_4_;
      auVar7._8_4_ = auVar5._8_4_ * auVar3._8_4_;
      auVar7._12_4_ = auVar5._12_4_ * auVar3._12_4_;
      auVar7._16_4_ = auVar5._16_4_ * auVar3._16_4_;
      auVar7._20_4_ = auVar5._20_4_ * auVar3._20_4_;
      auVar7._24_4_ = auVar5._24_4_ * auVar3._24_4_;
      auVar7._28_4_ = auVar3._28_4_;
      auVar12 = vfmaddsub231ps_fma(auVar7,auVar2,auVar4);
    }
    a = a + 8;
    *(undefined1 (*) [32])(out + -8) = ZEXT1632(auVar12);
  }
  lVar11 = N % 4;
  lVar9 = 0;
  while (0 < lVar11) {
    fVar1 = *(float *)((long)a + lVar9 + 4);
    lVar11 = lVar11 + -1;
    auVar13 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(*(undefined1 (*) [32])b + lVar9 + 4) * fVar1
                                            )),
                              ZEXT416((uint)*(float *)(*(undefined1 (*) [32])b + lVar9)),
                              ZEXT416(*(uint *)((long)a + lVar9)));
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * *(float *)(*(undefined1 (*) [32])b + lVar9))),
                              ZEXT416((uint)*(float *)(*(undefined1 (*) [32])b + lVar9 + 4)),
                              ZEXT416(*(uint *)((long)a + lVar9)));
    *(int *)((long)out + lVar9) = auVar13._0_4_;
    *(int *)((long)out + lVar9 + 4) = auVar12._0_4_;
    lVar9 = lVar9 + 8;
  }
  return;
}

Assistant:

void cvprod(float *a, float *b, float *out, long N){
/* complex vector product, can be in-place */
/* product of complex vector *a times complex vector *b */
/* INPUTS */
/* N vector length */
/* *a complex vector length N complex numbers */
/* *b complex vector length N complex numbers */
/* OUTPUTS */
/* *out complex vector length N */

long	OutCnt;		/* output counter */
float	A0R; 		/* A storage */
float	A0I; 		/* A storage */
float	A1R; 		/* A storage */
float	A1I; 		/* A storage */
float	A2R; 		/* A storage */
float	A2I; 		/* A storage */
float	A3R; 		/* A storage */
float	A3I; 		/* A storage */
float	B0R; 		/* B storage */
float	B0I; 		/* B storage */
float	B1R; 		/* B storage */
float	B1I; 		/* B storage */
float	B2R; 		/* B storage */
float	B2I; 		/* B storage */
float	B3R; 		/* B storage */
float	B3I; 		/* B storage */
float	T0R; 		/* TMP storage */
float	T0I; 		/* TMP storage */
float	T1R; 		/* TMP storage */
float	T1I; 		/* TMP storage */
float	T2R; 		/* TMP storage */
float	T2I; 		/* TMP storage */
float	T3R; 		/* TMP storage */
float	T3I; 		/* TMP storage */

if (N>=4){
	A0R = *a;
	B0R = *b;
	A0I = *(a +1);
	B0I = *(b +1);
	A1R = *(a +2);
	B1R = *(b +2);
	A1I = *(a +3);
	B1I = *(b +3);
	A2R = *(a +4);
	B2R = *(b +4);
	A2I = *(a +5);
	B2I = *(b +5);
	A3R = *(a +6);
	B3R = *(b +6);
	A3I = *(a +7);
	B3I = *(b +7);
	T0R = A0R * B0R;
	T0I = (A0R * B0I);
	T1R = A1R * B1R;
	T1I = (A1R * B1I);
	T2R = A2R * B2R;
	T2I = (A2R * B2I);
	T3R = A3R * B3R;
	T3I = (A3R * B3I);
	T0R -= (A0I * B0I);
	T0I = A0I * B0R + T0I;
	T1R -= (A1I * B1I);
	T1I = A1I * B1R + T1I;
	T2R -= (A2I * B2I);
	T2I = A2I * B2R + T2I;
	T3R -= (A3I * B3I);
	T3I = A3I * B3R + T3I;
	for (OutCnt=N/4-1; OutCnt > 0; OutCnt--){
		a += 8;
		b += 8;
		A0R = *a;
		B0R = *b;
		A0I = *(a +1);
		B0I = *(b +1);
		A1R = *(a +2);
		B1R = *(b +2);
		A1I = *(a +3);
		B1I = *(b +3);
		A2R = *(a +4);
		B2R = *(b +4);
		A2I = *(a +5);
		B2I = *(b +5);
		A3R = *(a +6);
		B3R = *(b +6);
		A3I = *(a +7);
		B3I = *(b +7);
		*out = T0R;
		*(out +1) = T0I;
		*(out +2) = T1R;
		*(out +3) = T1I;
		*(out +4) = T2R;
		*(out +5) = T2I;
		*(out +6) = T3R;
		*(out +7) = T3I;
		T0R = A0R * B0R;
		T0I = (A0R * B0I);
		T1R = A1R * B1R;
		T1I = (A1R * B1I);
		T2R = A2R * B2R;
		T2I = (A2R * B2I);
		T3R = A3R * B3R;
		T3I = (A3R * B3I);
		T0R -= (A0I * B0I);
		T0I = A0I * B0R + T0I;
		T1R -= (A1I * B1I);
		T1I = A1I * B1R + T1I;
		T2R -= (A2I * B2I);
		T2I = A2I * B2R + T2I;
		T3R -= (A3I * B3I);
		T3I = A3I * B3R + T3I;
		out += 8;
	}
	a += 8;
	b += 8;
	*out = T0R;
	*(out +1) = T0I;
	*(out +2) = T1R;
	*(out +3) = T1I;
	*(out +4) = T2R;
	*(out +5) = T2I;
	*(out +6) = T3R;
	*(out +7) = T3I;
	out += 8;
}
for (OutCnt=N%4; OutCnt > 0; OutCnt--){
	A0R = *a++;
	B0R = *b++;
	A0I = *a++;
	B0I = *b++;
	T0R = A0R * B0R;
	T0I = (A0R * B0I);
	T0R -= (A0I * B0I);
	T0I = A0I * B0R + T0I;
	*out++ = T0R;
	*out++ = T0I;
}
}